

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int connecting_getsock(Curl_easy *data,curl_socket_t *socks)

{
  curl_socket_t cVar1;
  curl_socket_t sockfd;
  connectdata *conn;
  curl_socket_t *socks_local;
  Curl_easy *data_local;
  
  if (data->conn == (connectdata *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    cVar1 = Curl_conn_get_socket(data,0);
    if (cVar1 == -1) {
      data_local._4_4_ = 0;
    }
    else {
      *socks = cVar1;
      data_local._4_4_ = 1;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int connecting_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd;

  if(!conn)
    return GETSOCK_BLANK;
  sockfd = Curl_conn_get_socket(data, FIRSTSOCKET);
  if(sockfd != CURL_SOCKET_BAD) {
    /* Default is to wait to something from the server */
    socks[0] = sockfd;
    return GETSOCK_READSOCK(0);
  }
  return GETSOCK_BLANK;
}